

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderSearch.h
# Opt level: O2

string * __thiscall
HeaderSearch::operator()[abi_cxx11_(string *__return_storage_ptr__,HeaderSearch *this,Token *token)

{
  pointer pcVar1;
  size_type sVar2;
  Page *pPVar3;
  string_view subtoken;
  string transformedHtmlPage;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> link;
  allocator<char> local_ea;
  allocator<char> local_e9;
  string local_e8;
  string local_c8;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> local_a8;
  string local_90;
  string local_70;
  string local_50;
  
  if (token->type == header) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"/w/cpp/header",(allocator<char> *)&local_c8);
    pPVar3 = SearchBase::getPage(&this->super_SearchBase,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string((string *)&local_50,(string *)&pPVar3->content);
    replaceHtmlSymbols(&local_c8,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pcVar1 = (token->content)._M_dataplus._M_p;
    sVar2 = (token->content)._M_string_length;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"<tt>",&local_e9);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"</tt>",&local_ea);
    subtoken._M_str = pcVar1;
    subtoken._M_len = sVar2;
    SearchBase::findLinkToSubtoken
              (&local_a8,&this->super_SearchBase,&local_c8,subtoken,&local_e8,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_e8);
    if (local_a8.
        super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_engaged == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_e8);
    }
    else {
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)__return_storage_ptr__,
                 (basic_string_view<char,_std::char_traits<char>_> *)&local_a8,
                 (allocator<char> *)&local_e8);
    }
    std::__cxx11::string::~string((string *)&local_c8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(const Token& token) {
			if (token.type != Token::Type::header) {
				return "";
			}


			Page* page = getPage("/w/cpp/header");
			const std::string transformedHtmlPage = replaceHtmlSymbols(page->content);
			const std::optional<std::string_view> link = findLinkToSubtoken(transformedHtmlPage, token.content, "<tt>", "</tt>");
			if (!link.has_value()) {
				return "";
			}

			return std::string(link.value());
		}